

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMRangeImpl::selectNode(DOMRangeImpl *this,DOMNode *refNode)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  DOMRangeException *this_00;
  undefined4 extraout_var;
  XMLSize_t XVar4;
  undefined4 extraout_var_00;
  DOMNode *pDVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *local_40;
  DOMNode *n;
  XMLSize_t i;
  DOMNode *parent;
  short type;
  DOMNode *refNode_local;
  DOMRangeImpl *this_local;
  undefined4 extraout_var_01;
  
  validateNode(this,refNode);
  bVar1 = isLegalContainedNode(this,refNode);
  if (!bVar1) {
    this_00 = (DOMRangeException *)__cxa_allocate_exception(0x28);
    DOMRangeException::DOMRangeException(this_00,0x70,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMRangeException::typeinfo,DOMRangeException::~DOMRangeException);
  }
  iVar3 = (*refNode->_vptr_DOMNode[4])();
  sVar2 = (short)iVar3;
  if ((((sVar2 == 3) || (sVar2 == 4)) || (sVar2 == 8)) || (sVar2 == 7)) {
    this->fStartContainer = refNode;
    this->fEndContainer = refNode;
    this->fStartOffset = 0;
    if (sVar2 == 7) {
      iVar3 = (*refNode->_vptr_DOMNode[0x29])();
      XVar4 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var,iVar3));
      this->fEndOffset = XVar4;
    }
    else {
      iVar3 = (*refNode->_vptr_DOMNode[0x29])();
      this->fEndOffset = CONCAT44(extraout_var_00,iVar3);
    }
  }
  else {
    iVar3 = (*refNode->_vptr_DOMNode[5])();
    pDVar5 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
    if (pDVar5 != (DOMNode *)0x0) {
      this->fStartContainer = pDVar5;
      this->fEndContainer = pDVar5;
      n = (DOMNode *)0x0;
      iVar3 = (*pDVar5->_vptr_DOMNode[7])();
      local_40 = (DOMNode *)CONCAT44(extraout_var_02,iVar3);
      while (local_40 != (DOMNode *)0x0 && local_40 != refNode) {
        n = (DOMNode *)((long)&n->_vptr_DOMNode + 1);
        iVar3 = (*local_40->_vptr_DOMNode[10])();
        local_40 = (DOMNode *)CONCAT44(extraout_var_03,iVar3);
      }
      this->fStartOffset = (XMLSize_t)n;
      this->fEndOffset = this->fStartOffset + 1;
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::selectNode(const DOMNode* refNode)
{
    validateNode(refNode);
    if ( !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }
    //First check for the text type node
    short type = refNode->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        //The node itself is the container.
        fStartContainer = (DOMNode*) refNode;
        fEndContainer   = (DOMNode*) refNode;

        //Select all the contents of the node
        fStartOffset = 0;
        if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
            fEndOffset = XMLString::stringLen(((DOMProcessingInstruction*)refNode)->getData());
        else
            fEndOffset = ((DOMText *)refNode)->getLength();
        return;
    }

    DOMNode* parent = refNode->getParentNode();
    if (parent != 0 ) // REVIST: what to do if it IS 0?
    {
        fStartContainer = parent;
        fEndContainer = parent;

        XMLSize_t i = 0;
        for (DOMNode* n = parent->getFirstChild(); n!=0 && n!=refNode; n = n->getNextSibling()) {
            i++;
        }

        fStartOffset = i;
        fEndOffset = fStartOffset+1;
    }
}